

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

void Rml::ElementUtilities::GetElementsByTagName
               (ElementList *elements,Element *root_element,String *tag)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  reference ppEVar5;
  String *__lhs;
  Element *local_a8;
  int local_9c;
  value_type pEStack_98;
  int i_1;
  Element *element;
  int local_74;
  undefined1 local_70 [4];
  int i;
  SearchQueue search_queue;
  String *tag_local;
  Element *root_element_local;
  ElementList *elements_local;
  
  search_queue.c.super__Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)tag;
  ::std::queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>>::
  queue<std::deque<Rml::Element*,std::allocator<Rml::Element*>>,void>
            ((queue<Rml::Element*,std::deque<Rml::Element*,std::allocator<Rml::Element*>>> *)
             local_70);
  for (local_74 = 0; iVar1 = local_74, iVar4 = Element::GetNumChildren(root_element,false),
      iVar1 < iVar4; local_74 = local_74 + 1) {
    element = Element::GetChild(root_element,local_74);
    ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::push
              ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                *)local_70,&element);
  }
  while (bVar2 = ::std::
                 queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                 ::empty((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                          *)local_70), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppEVar5 = ::std::
              queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
              front((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                     *)local_70);
    pEStack_98 = *ppEVar5;
    ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::pop
              ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                *)local_70);
    __lhs = Element::GetTagName_abi_cxx11_(pEStack_98);
    _Var3 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)search_queue.c.
                                       super__Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (_Var3) {
      ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back
                (elements,&stack0xffffffffffffff68);
    }
    for (local_9c = 0; iVar1 = local_9c, iVar4 = Element::GetNumChildren(pEStack_98,false),
        iVar1 < iVar4; local_9c = local_9c + 1) {
      local_a8 = Element::GetChild(pEStack_98,local_9c);
      ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::
      push((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
           local_70,&local_a8);
    }
  }
  ::std::queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>::~queue
            ((queue<Rml::Element_*,_std::deque<Rml::Element_*,_std::allocator<Rml::Element_*>_>_> *)
             local_70);
  return;
}

Assistant:

void ElementUtilities::GetElementsByTagName(ElementList& elements, Element* root_element, const String& tag)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	for (int i = 0; i < root_element->GetNumChildren(); ++i)
		search_queue.push(root_element->GetChild(i));

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetTagName() == tag)
			elements.push_back(element);

		// Add all children to search.
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}
}